

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

Class * __thiscall
Population::crossover(Class *__return_storage_ptr__,Population *this,Class *class1,Class *class2)

{
  size_t sVar1;
  undefined4 uVar2;
  bool bVar3;
  Class *pCVar4;
  
  Class::Class(__return_storage_ptr__);
  Time::operator=(&__return_storage_ptr__->time,&class1->time);
  Group::operator=(&__return_storage_ptr__->group,&class2->group);
  bVar3 = RandomBool();
  pCVar4 = class2;
  if (bVar3) {
    pCVar4 = class1;
  }
  uVar2 = *(undefined4 *)&(pCVar4->room).field_0x4;
  sVar1 = (pCVar4->room).capacity;
  (__return_storage_ptr__->room).number = (pCVar4->room).number;
  *(undefined4 *)&(__return_storage_ptr__->room).field_0x4 = uVar2;
  (__return_storage_ptr__->room).capacity = sVar1;
  RandomBool();
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->teacher);
  bVar3 = RandomBool();
  if (bVar3) {
    Subject::operator=(&__return_storage_ptr__->subject,&class1->subject);
  }
  else {
    Subject::operator=(&__return_storage_ptr__->subject,&class2->subject);
  }
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->teacher);
  return __return_storage_ptr__;
}

Assistant:

Class Population::crossover(const Class& class1, const Class& class2) const {
    Class res;
    res.time = class1.time;
    res.group = class2.group;
    if (RandomBool()) {
        res.room = class1.room;
    } else {
        res.room = class2.room;
    }

    if (RandomBool()) {
        res.teacher = class1.teacher;
    } else {
        res.teacher = class2.teacher;
    }

    if (RandomBool()) {
        res.subject = class1.subject;
        res.teacher = class1.teacher;
    } else {
        res.subject = class2.subject;
        res.teacher = class2.teacher;
    }

    return res;
}